

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LateCallDescriptor.cpp
# Opt level: O2

int __thiscall
ninx::parser::util::LateCallDescriptor::clone
          (LateCallDescriptor *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _func_int **local_20;
  
  element::ASTElement::clone<ninx::parser::element::Block>((ASTElement *)&local_20);
  std::
  make_unique<ninx::parser::util::LateCallDescriptor,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>,ninx::parser::element::FunctionDefinition*&,ninx::parser::element::Block*&>
            (&this->body,(FunctionDefinition **)&local_20,(Block **)(__fn + 8));
  if (local_20 != (_func_int **)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return (int)this;
}

Assistant:

std::unique_ptr<ninx::parser::util::LateCallDescriptor> ninx::parser::util::LateCallDescriptor::clone() {
    return std::make_unique<LateCallDescriptor>(body->clone<ninx::parser::element::Block>(), function, target_object);
}